

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

bool __thiscall
QStyleSheetStyle::styleSheetPalette
          (QStyleSheetStyle *this,QWidget *w,QStyleOption *opt,QPalette *pal)

{
  long lVar1;
  QStyleSheetStyle *pQVar2;
  QWidget *w_00;
  quint64 qVar3;
  quint64 qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QRenderRule rule;
  
  pQVar2 = globalStyleSheetStyle;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pal == (QPalette *)0x0 || (opt == (QStyleOption *)0x0 || w == (QWidget *)0x0)) ||
     (globalStyleSheetStyle != (QStyleSheetStyle *)0x0 &&
      globalStyleSheetStyle != (QStyleSheetStyle *)this)) {
    bVar5 = false;
  }
  else {
    if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
      globalStyleSheetStyle = (QStyleSheetStyle *)this;
    }
    w_00 = containerWidget(w);
    memset(&rule,0xaa,0x88);
    qVar3 = pseudoClass((State)(opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i);
    qVar4 = extendedPseudoClass(w_00);
    renderRule(&rule,this,&w_00->super_QObject,0,qVar3 | qVar4);
    bVar5 = rule.pal.d.ptr != (QStyleSheetPaletteData *)0x0;
    if (bVar5) {
      QRenderRule::configurePalette(&rule,pal,NoRole,NoRole);
    }
    QRenderRule::~QRenderRule(&rule);
    if (pQVar2 == (QStyleSheetStyle *)0x0) {
      globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::styleSheetPalette(const QWidget* w, const QStyleOption* opt, QPalette* pal)
{
    if (!w || !opt || !pal)
        return false;

    RECURSION_GUARD(return false)

    w = containerWidget(w);

    QRenderRule rule = renderRule(w, PseudoElement_None, pseudoClass(opt->state) | extendedPseudoClass(w));
    if (!rule.hasPalette())
        return false;

    rule.configurePalette(pal, QPalette::NoRole, QPalette::NoRole);
    return true;
}